

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CenterOfMass.cpp
# Opt level: O2

void __thiscall OpenMD::CenterOfMass::doFrame(CenterOfMass *this,int param_1)

{
  SelectionManager *this_00;
  double s;
  StuntDouble *this_01;
  int extraout_EDX;
  int __denom;
  int extraout_EDX_00;
  int *piVar1;
  int i;
  Vector3d com;
  int local_7c;
  SelectionSet local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_78,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet(&(this->super_SequentialAnalyzer).seleMan1_,&local_78);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_78.bitsets_);
  }
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,(Vector<double,_3U> *)OpenMD::V3Zero);
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  piVar1 = &local_7c;
  this_01 = SelectionManager::beginSelected(this_00,&local_7c);
  __denom = extraout_EDX;
  while (this_01 != (StuntDouble *)0x0) {
    s = this_01->mass_;
    StuntDouble::getPos((Vector3d *)&local_60,this_01);
    operator*(&local_48,&local_60,s);
    Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
    piVar1 = &local_7c;
    this_01 = SelectionManager::nextSelected(this_00,&local_7c);
    __denom = extraout_EDX_00;
  }
  Vector<double,_3U>::div((Vector<double,_3U> *)&local_78,(int)piVar1,__denom);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->values_,(value_type *)&local_78);
  return;
}

Assistant:

void CenterOfMass::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    RealType mtot = 0.0;
    Vector3d com(V3Zero);
    RealType mass;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      mass = sd->getMass();
      mtot += mass;
      com += sd->getPos() * mass;
    }

    com /= mtot;

    values_.push_back(com);
  }